

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

int __thiscall IMLE::init(IMLE *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long size;
  size_type __n;
  string *in_stack_fffffffffffffe78;
  IMLE *this_00;
  Index in_stack_fffffffffffffe88;
  Scalar *value;
  Scalar *in_stack_fffffffffffffe98;
  Scalar *value_00;
  Index in_stack_fffffffffffffea0;
  undefined1 *cols;
  Index in_stack_fffffffffffffea8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_01;
  allocator local_f1;
  string local_f0 [32];
  double local_d0;
  double local_98;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_90;
  undefined1 local_78 [24];
  Scalar local_60 [3];
  double local_48;
  Scalar local_40 [3];
  undefined4 local_c;
  IMLE *local_8;
  
  local_c = SUB84(ctx,0);
  this_00 = (IMLE *)&stack0xffffffffffffffd8;
  local_8 = this;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffffe88,(Index)this_00);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffe78);
  size = (long)this->d;
  local_48 = std::numeric_limits<double>::infinity();
  value = local_40;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffe78);
  value_00 = local_60;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(size);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe78);
  cols = local_78;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(size);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe78);
  __n = (size_type)this->D;
  local_98 = std::numeric_limits<double>::infinity();
  this_01 = &local_90;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant((Index)value_00,value);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffe78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(size,(Index)this_00);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffe78);
  local_d0 = std::numeric_limits<double>::infinity();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Constant(__n,(Index)cols,value_00);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffe78);
  std::vector<int,_std::allocator<int>_>::reserve((vector<int,_std::allocator<int>_> *)this_01,__n);
  std::vector<int,_std::allocator<int>_>::reserve((vector<int,_std::allocator<int>_> *)this_01,__n);
  std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::reserve
            ((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_> *)
             this_01,__n);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)this_01,__n);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)this_01,__n);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)this_01,__n);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(this_01,__n);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(this_01,__n);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)this_01,__n);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(this_01,__n);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)this_01,__n);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"IMLE object created.",&local_f1);
  message(this_00,in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(local_f0);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return iVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::init(int pre_alloc)
{
    zeroZZ = ZZ::Zero(d,d); //Template: ZZ::Zero()
    infinityZZ = ZZ::Constant( d,d, std::numeric_limits<Scal>::infinity() ); //Template: ZZ::Constant( std::numeric_limits<Scal>::infinity() )
    zeroZ = Z::Zero(d);     //Template: Z::Zero()
    zeroX = X::Zero(D);     //Template: X::Zero()
	infinityX = X::Constant( D, std::numeric_limits<Scal>::infinity() ); //Template: X::Constant( std::numeric_limits<Scal>::infinity() )
    zeroXZ = XZ::Zero(D,d); //Template: XZ::Zero()
    infinityXZ = XZ::Constant( D,d, std::numeric_limits<Scal>::infinity() ); //Template: XZ::Constant( std::numeric_limits<Scal>::infinity() )

    sNearest.reserve(INIT_SIZE);
    sNearestInv.reserve(INIT_SIZE);

    experts.reserve( pre_alloc );

	predictions.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsVar.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsWeight.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsJacobian.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsVarJacobian.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictions.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictionsVar.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictionsWeight.reserve(MAX_NUMBER_OF_SOLUTIONS);

	message(IMLE_CRTD);
}